

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  pointer *pppFVar1;
  Tables *pTVar2;
  iterator __position;
  Descriptor *pDVar3;
  int iVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  _Rb_tree_node_base *p_Var12;
  MutexLockMaybe lock;
  vector<int,_std::allocator<int>_> numbers;
  __node_gen_type __node_gen;
  Descriptor *local_68;
  MutexLockMaybe local_60;
  void *local_58;
  void *pvStack_50;
  undefined8 local_48;
  key_type local_40;
  
  local_68 = extendee;
  internal::MutexLockMaybe::MutexLockMaybe(&local_60,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
    if ((this->fallback_database_ != (DescriptorDatabase *)0x0) &&
       (cVar5 = std::
                _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(((this->tables_)._M_t.
                          super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                         _M_head_impl)->extensions_loaded_from_db_)._M_h,&local_68),
       cVar5.super__Node_iterator_base<const_google::protobuf::Descriptor_*,_false>._M_cur ==
       (__node_type *)0x0)) {
      local_58 = (void *)0x0;
      pvStack_50 = (void *)0x0;
      local_48 = 0;
      iVar4 = (*this->fallback_database_->_vptr_DescriptorDatabase[5])
                        (this->fallback_database_,*(undefined8 *)(local_68 + 8));
      if ((char)iVar4 != '\0') {
        if (pvStack_50 != local_58) {
          uVar10 = 0;
          do {
            iVar4 = *(int *)((long)local_58 + uVar10 * 4);
            pTVar2 = (this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl;
            local_40.first = local_68;
            local_40.second = iVar4;
            cVar6 = std::
                    _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                    ::find(&(pTVar2->extensions_)._M_t,&local_40);
            if (((_Rb_tree_header *)cVar6._M_node ==
                 &(pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header) ||
               (cVar6._M_node[1]._M_left == (_Base_ptr)0x0)) {
              TryFindExtensionInFallbackDatabase(this,local_68,iVar4);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)pvStack_50 - (long)local_58 >> 2));
        }
        local_40.first =
             (Descriptor *)
             &((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->extensions_loaded_from_db_;
        std::
        _Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,std::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<google::protobuf::Descriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::Descriptor_const*,false>>>>
                  ((_Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,std::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_40.first,&local_68);
      }
      if (local_58 != (void *)0x0) {
        operator_delete(local_58);
      }
    }
  }
  pDVar3 = local_68;
  pTVar2 = (this->tables_)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  p_Var7 = (pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Rb_tree_node_base *)0x0) {
    p_Var11 = &(pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var12 = &p_Var11->_M_header;
    do {
      if ((*(Descriptor **)(p_Var7 + 1) < local_68) ||
         ((lVar9 = 0x10, p_Var8 = p_Var7, *(Descriptor **)(p_Var7 + 1) <= local_68 &&
          (*(int *)&p_Var7[1]._M_parent < 0)))) {
        lVar9 = 0x18;
        p_Var8 = p_Var12;
      }
      p_Var7 = *(_Rb_tree_node_base **)((long)&p_Var7->_M_color + lVar9);
      p_Var12 = p_Var8;
    } while (p_Var7 != (_Rb_tree_node_base *)0x0);
    for (; ((_Rb_tree_header *)p_Var8 != p_Var11 && (*(Descriptor **)(p_Var8 + 1) == pDVar3));
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      __position._M_current =
           (out->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)out,__position,(FieldDescriptor **)&p_Var8[1]._M_left);
      }
      else {
        *__position._M_current = (FieldDescriptor *)p_Var8[1]._M_left;
        pppFVar1 = &(out->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
    }
  }
  if (this->underlay_ != (DescriptorPool *)0x0) {
    FindAllExtensions(this->underlay_,local_68,out);
  }
  if ((pthread_mutex_t *)local_60.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_60.mu_);
  }
  return;
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != nullptr &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    std::vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == nullptr) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != nullptr) {
    underlay_->FindAllExtensions(extendee, out);
  }
}